

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GyroscopeSensor.cpp
# Opt level: O2

void __thiscall
iDynTree::GyroscopeSensor::GyroscopeSensor(GyroscopeSensor *this,GyroscopeSensor *other)

{
  GyroscopePrivateAttributes *this_00;
  
  (this->super_LinkSensor).super_Sensor._vptr_Sensor = (_func_int **)&PTR__GyroscopeSensor_001e6a18;
  this_00 = (GyroscopePrivateAttributes *)operator_new(0xa8);
  GyroscopePrivateAttributes::GyroscopePrivateAttributes(this_00,other->pimpl);
  this->pimpl = this_00;
  return;
}

Assistant:

GyroscopeSensor::GyroscopeSensor(const GyroscopeSensor& other):
    pimpl(new GyroscopePrivateAttributes(*(other.pimpl)))
{

}